

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

void __thiscall icu_63::RuleBasedCollator::~RuleBasedCollator(RuleBasedCollator *this)

{
  (this->super_Collator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedCollator_003dd2e0;
  SharedObject::clearPtr<icu_63::CollationSettings>(&this->settings);
  SharedObject::clearPtr<icu_63::CollationCacheEntry>(&this->cacheEntry);
  Locale::~Locale(&this->validLocale);
  Collator::~Collator(&this->super_Collator);
  return;
}

Assistant:

RuleBasedCollator::~RuleBasedCollator() {
    SharedObject::clearPtr(settings);
    SharedObject::clearPtr(cacheEntry);
}